

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void __thiscall
Wrapper<CustomUintFormatter<1,false>,AddrManImpl::Format&>::Unserialize<HashVerifier<AutoFile>>
          (Wrapper<CustomUintFormatter<1,false>,AddrManImpl::Format&> *this,
          HashVerifier<AutoFile> *s)

{
  uchar *puVar1;
  size_t in_RCX;
  long in_FS_OFFSET;
  uint64_t raw;
  uchar local_28 [8];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = *(uchar **)this;
  local_28[0] = '\0';
  local_28[1] = '\0';
  local_28[2] = '\0';
  local_28[3] = '\0';
  local_28[4] = '\0';
  local_28[5] = '\0';
  local_28[6] = '\0';
  local_28[7] = '\0';
  AutoFile::read(s->m_source,(int)local_28,(void *)0x1,in_RCX);
  CSHA256::Write((CSHA256 *)s,local_28,1);
  *puVar1 = local_28[0];
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream &s) const { Formatter().Ser(s, m_object); }